

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioWaveTxAt(void)

{
  FILE *pFVar1;
  long lVar2;
  rawWaveInfo_t *prVar3;
  uint uVar4;
  uint uVar5;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: \n",myTimeStamp::buf,"gpioWaveTxAt");
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
            "gpioWaveTxAt");
    return -0x1f;
  }
  uVar4 = 0xffffd8f1;
  if (dmaOut[1] != 0) {
    lVar2 = 0;
    do {
      uVar5 = dmaOut[1] - *(int *)(dmaOBus + lVar2);
      if (uVar5 < 0xec0) goto LAB_001148de;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xd5);
    if (dmaOut[1] != 0) {
      lVar2 = 0;
      do {
        uVar5 = dmaOut[1] - *(int *)(dmaOBus + lVar2);
        if (uVar5 < 0xec0) goto LAB_001148de;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0xd5);
      uVar4 = 0xffffd8f2;
    }
  }
LAB_00114918:
  return -uVar4;
LAB_001148de:
  uVar4 = (int)lVar2 * 0x76 + (uVar5 >> 5);
  if (-1 < (int)uVar4) {
    prVar3 = waveInfo;
    lVar2 = 0;
    while( true ) {
      if (lVar2 == 0xfa) {
        return 0x270e;
      }
      if (((prVar3->deleted == 0) && ((int)(uint)prVar3->botCB <= (int)uVar4)) &&
         (uVar4 <= prVar3->topCB)) break;
      lVar2 = lVar2 + 1;
      prVar3 = prVar3 + 1;
    }
    return (int)lVar2;
  }
  goto LAB_00114918;
}

Assistant:

int gpioWaveTxAt(void)
{
   int i, cb;

   DBG(DBG_USER, "");

   CHECK_INITED;

   cb = dmaNowAtOCB();

   if (cb < 0) return -cb;

   for (i=0; i<PI_MAX_WAVES; i++)
   {
      if ( !waveInfo[i].deleted &&
          (cb >= waveInfo[i].botCB) &&
          (cb <= waveInfo[i].topCB) ) return i;
   }

   return PI_WAVE_NOT_FOUND;
}